

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O2

void __thiscall embree::FilteredStatistics::add(FilteredStatistics *this,float a)

{
  double dVar1;
  double dVar2;
  long lVar3;
  pointer pfVar4;
  size_t i;
  ulong uVar5;
  pointer pfVar6;
  undefined1 auVar7 [16];
  float local_4c;
  double local_48;
  double dStack_40;
  
  local_4c = a;
  std::vector<float,_std::allocator<float>_>::push_back(&this->v,&local_4c);
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<float>>>
            ((this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pfVar6 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pfVar4 - (long)pfVar6 >> 2;
  auVar7._8_4_ = (int)((long)pfVar4 - (long)pfVar6 >> 0x22);
  auVar7._0_8_ = lVar3;
  auVar7._12_4_ = 0x45300000;
  dStack_40 = auVar7._8_8_ - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  dVar1 = floor((double)this->fskip_small * 0.5 * local_48);
  dVar2 = floor((double)this->fskip_large * 0.5 * local_48);
  (this->stat).v = 0.0;
  (this->stat).v2 = 0.0;
  (this->stat).vmin = INFINITY;
  (this->stat).vmax = -INFINITY;
  (this->stat).N = 0;
  for (uVar5 = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
      uVar5 < (ulong)(((long)pfVar4 - (long)pfVar6 >> 2) -
                     ((long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2));
      uVar5 = uVar5 + 1) {
    Statistics::add(&this->stat,pfVar6[uVar5]);
    pfVar6 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

void add(float a) 
    {
      v.push_back(a);
      std::sort(v.begin(),v.end(),std::less<float>());
      size_t skip_small = (size_t) floor(0.5*fskip_small*double(v.size()));
      size_t skip_large = (size_t) floor(0.5*fskip_large*double(v.size()));

      stat = Statistics();
      for (size_t i=skip_small; i<v.size()-skip_large; i++)
        stat.add(v[i]);
    }